

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

int lws_parse_numeric_address(char *ads,uint8_t *result,size_t max_len)

{
  bool bVar1;
  int iVar2;
  lws_tokenize_elem lVar3;
  char *pcVar4;
  int iVar5;
  undefined1 *puVar6;
  bool bVar7;
  long lStack_90;
  int ow;
  long u;
  size_t n;
  char cStack_78;
  char cStack_77;
  char cStack_76;
  char t [5];
  int dm;
  int skip_point;
  int ipv6;
  int sects;
  uint8_t temp [16];
  uint8_t *orig;
  lws_tokenize ts;
  size_t max_len_local;
  uint8_t *result_local;
  char *ads_local;
  
  skip_point = 0;
  temp._8_8_ = result;
  ts._32_8_ = max_len;
  pcVar4 = strchr(ads,0x3a);
  bVar7 = pcVar4 != (char *)0x0;
  t[1] = -1;
  t[2] = -1;
  t[3] = -1;
  t[4] = -1;
  cStack_78 = '\0';
  cStack_77 = '\0';
  cStack_76 = '\0';
  t[0] = '\0';
  lws_tokenize_init((lws_tokenize *)&orig,ads,0x41);
  ts.token = (char *)strlen(ads);
  if ((bVar7) || ((char *)0x6 < ts.token)) {
    if ((bVar7) && (ts.token < (char *)0x2)) {
      ads_local._4_4_ = -2;
    }
    else if ((bVar7) || (3 < (ulong)ts._32_8_)) {
      if ((bVar7) && ((ulong)ts._32_8_ < 0x10)) {
        ads_local._4_4_ = -4;
      }
      else {
        max_len_local = (size_t)result;
        if (bVar7) {
          memset(result,0,ts._32_8_);
        }
        do {
          lVar3 = lws_tokenize((lws_tokenize *)&orig);
          ts.token_len._3_1_ = (char)lVar3;
          iVar2 = (int)temp._8_8_;
          if (ts.token_len._3_1_ == '\0') {
            iVar5 = (int)max_len_local;
            if ((!bVar7) && (skip_point == 4)) {
              return iVar5 - iVar2;
            }
            if ((bVar7) && (skip_point == 8)) {
              return iVar5 - iVar2;
            }
            if (t._1_4_ == -1) {
              return -0xc;
            }
            iVar5 = iVar5 - iVar2;
            if (iVar5 == 0x10) {
              return 0x10;
            }
            memcpy(&ipv6,(void *)(temp._8_8_ + (long)(int)t._1_4_),(long)(iVar5 - t._1_4_));
            memset((void *)(temp._8_8_ + (long)(int)t._1_4_),0,(long)(0x10 - t._1_4_));
            memcpy((void *)(temp._8_8_ + (long)(0x10 - (iVar5 - t._1_4_))),&ipv6,
                   (long)(iVar5 - t._1_4_));
            return 0x10;
          }
          if (ts.token_len._3_1_ == '\x01') {
            iVar5 = _cStack_78 + 1;
            if (_cStack_78 == 0) {
              if ((((bVar7) && (*(char *)(temp._8_8_ + 2) == -1)) &&
                  (*(char *)(temp._8_8_ + 3) == -1)) && (t._1_4_ == 2)) {
                bVar7 = false;
                _cStack_78 = iVar5;
                memset((void *)temp._8_8_,0,ts._32_8_);
                *(undefined1 *)(temp._8_8_ + 10) = 0xff;
                *(undefined1 *)(temp._8_8_ + 0xb) = 0xff;
                t[1] = -1;
                t[2] = -1;
                t[3] = -1;
                t[4] = -1;
                max_len_local = temp._8_8_ + 0xc;
                skip_point = 0;
              }
              else {
                if ((bVar7) && (*ts.start != ':')) {
                  return -10;
                }
                _cStack_78 = iVar5;
                if ((!bVar7) && (*ts.start != '.')) {
                  return -0xb;
                }
              }
            }
            else {
              if (2 < iVar5) {
                return -8;
              }
              if (*ts.start != ':') {
                return -9;
              }
              puVar6 = (undefined1 *)(max_len_local + 1);
              *(undefined1 *)max_len_local = 0;
              max_len_local = max_len_local + 2;
              *puVar6 = 0;
              t._1_4_ = (int)max_len_local - iVar2;
              _cStack_78 = iVar5;
            }
          }
          else {
            if (ts.token_len._3_1_ != '\x02') {
              _lws_log(1,"%s: malformed ip address\n","lws_parse_numeric_address");
              return -0xd;
            }
            cStack_78 = '\0';
            cStack_77 = '\0';
            cStack_76 = '\0';
            t[0] = '\0';
            if (bVar7) {
              if (4 < ts.len) {
                return -1;
              }
              memcpy((void *)((long)&n + 3),ts.start,ts.len);
              *(undefined1 *)((long)&n + ts.len + 3) = 0;
              for (u = 0; (ulong)u < ts.len; u = u + 1) {
                if ((((*(char *)((long)&n + u + 3) < '0') || ('f' < *(char *)((long)&n + u + 3))) ||
                    (('9' < *(char *)((long)&n + u + 3) && (*(char *)((long)&n + u + 3) < 'A')))) ||
                   (('F' < *(char *)((long)&n + u + 3) && (*(char *)((long)&n + u + 3) < 'a')))) {
                  return -1;
                }
              }
              lStack_90 = strtol((char *)((long)&n + 3),(char **)0x0,0x10);
              if (0xffff < lStack_90) {
                return -5;
              }
              *(char *)max_len_local = (char)((ulong)lStack_90 >> 8);
              max_len_local = max_len_local + 1;
            }
            else {
              if (3 < ts.len) {
                return -1;
              }
              memcpy((void *)((long)&n + 3),ts.start,ts.len);
              *(undefined1 *)((long)&n + ts.len + 3) = 0;
              for (u = 0; (ulong)u < ts.len; u = u + 1) {
                if ((*(char *)((long)&n + u + 3) < '0') || ('9' < *(char *)((long)&n + u + 3))) {
                  return -1;
                }
              }
              lStack_90 = strtol((char *)((long)&n + 3),(char **)0x0,10);
              if (0xff < lStack_90) {
                return -6;
              }
            }
            if (lStack_90 < 0) {
              return -7;
            }
            *(char *)max_len_local = (char)lStack_90;
            skip_point = skip_point + 1;
            max_len_local = max_len_local + 1;
          }
          bVar1 = false;
          if ('\0' < ts.token_len._3_1_) {
            bVar1 = (long)(max_len_local - temp._8_8_) <= (long)ts._32_4_;
          }
        } while (bVar1);
        _lws_log(1,"%s: ended on e %d\n","lws_parse_numeric_address",
                 (ulong)(uint)(int)ts.token_len._3_1_);
        ads_local._4_4_ = -0xe;
      }
    }
    else {
      ads_local._4_4_ = -3;
    }
  }
  else {
    ads_local._4_4_ = -1;
  }
  return ads_local._4_4_;
}

Assistant:

int
lws_parse_numeric_address(const char *ads, uint8_t *result, size_t max_len)
{
	struct lws_tokenize ts;
	uint8_t *orig = result, temp[16];
	int sects = 0, ipv6 = !!strchr(ads, ':'), skip_point = -1, dm = 0;
	char t[5];
	size_t n;
	long u;

	lws_tokenize_init(&ts, ads, LWS_TOKENIZE_F_NO_INTEGERS |
				    LWS_TOKENIZE_F_MINUS_NONTERM);
	ts.len = strlen(ads);
	if (!ipv6 && ts.len < 7)
		return -1;

	if (ipv6 && ts.len < 2)
		return -2;

	if (!ipv6 && max_len < 4)
		return -3;

	if (ipv6 && max_len < 16)
		return -4;

	if (ipv6)
		memset(result, 0, max_len);

	do {
		ts.e = lws_tokenize(&ts);
		switch (ts.e) {
		case LWS_TOKZE_TOKEN:
			dm = 0;
			if (ipv6) {
				if (ts.token_len > 4)
					return -1;
				memcpy(t, ts.token, ts.token_len);
				t[ts.token_len] = '\0';
				for (n = 0; n < ts.token_len; n++)
					if (t[n] < '0' || t[n] > 'f' ||
					    (t[n] > '9' && t[n] < 'A') ||
					    (t[n] > 'F' && t[n] < 'a'))
						return -1;
				u = strtol(t, NULL, 16);
				if (u > 0xffff)
					return -5;
				*result++ = (uint8_t)(u >> 8);
			} else {
				if (ts.token_len > 3)
					return -1;
				memcpy(t, ts.token, ts.token_len);
				t[ts.token_len] = '\0';
				for (n = 0; n < ts.token_len; n++)
					if (t[n] < '0' || t[n] > '9')
						return -1;
				u = strtol(t, NULL, 10);
				if (u > 0xff)
					return -6;
			}
			if (u < 0)
				return -7;
			*result++ = (uint8_t)u;
			sects++;
			break;

		case LWS_TOKZE_DELIMITER:
			if (dm++) {
				if (dm > 2)
					return -8;
				if (*ts.token != ':')
					return -9;
				/* back to back : */
				*result++ = 0;
				*result++ = 0;
				skip_point = lws_ptr_diff(result, orig);
				break;
			}
			if (ipv6 && orig[2] == 0xff && orig[3] == 0xff &&
			    skip_point == 2) {
				/* ipv4 backwards compatible format */
				ipv6 = 0;
				memset(orig, 0, max_len);
				orig[10] = 0xff;
				orig[11] = 0xff;
				skip_point = -1;
				result = &orig[12];
				sects = 0;
				break;
			}
			if (ipv6 && *ts.token != ':')
				return -10;
			if (!ipv6 && *ts.token != '.')
				return -11;
			break;

		case LWS_TOKZE_ENDED:
			if (!ipv6 && sects == 4)
				return lws_ptr_diff(result, orig);
			if (ipv6 && sects == 8)
				return lws_ptr_diff(result, orig);
			if (skip_point != -1) {
				int ow = lws_ptr_diff(result, orig);
				/*
				 * contains ...::...
				 */
				if (ow == 16)
					return 16;
				memcpy(temp, &orig[skip_point], ow - skip_point);
				memset(&orig[skip_point], 0, 16 - skip_point);
				memcpy(&orig[16 - (ow - skip_point)], temp,
						   ow - skip_point);

				return 16;
			}
			return -12;

		default: /* includes ENDED */
			lwsl_err("%s: malformed ip address\n",
				 __func__);

			return -13;
		}
	} while (ts.e > 0 && result - orig <= (int)max_len);

	lwsl_err("%s: ended on e %d\n", __func__, ts.e);

	return -14;
}